

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O2

size_t __thiscall hrvo::Simulator::addAgent(Simulator *this,Vector2 *position,size_t goalNo)

{
  Agent *this_00;
  runtime_error *this_01;
  allocator local_49;
  Agent *agent;
  
  if (this->defaults_ != (Agent *)0x0) {
    this_00 = (Agent *)operator_new(0xd8);
    Agent::Agent(this_00,this,position,goalNo);
    agent = this_00;
    std::vector<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::push_back(&this->agents_,&agent);
    return ((long)(this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&agent,"Agent defaults not set when adding agent.",&local_49);
  std::runtime_error::runtime_error(this_01,(string *)&agent);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::size_t Simulator::addAgent(const Vector2 &position, std::size_t goalNo) {
  if (defaults_ == NULL) {
    throw std::runtime_error("Agent defaults not set when adding agent.");
  }

  Agent *const agent = new Agent(this, position, goalNo);
  agents_.push_back(agent);

  return agents_.size() - 1U;
}